

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O1

void __thiscall slang::ast::builtins::Builtins::registerMathFuncs(Builtins *this)

{
  BooleanBitVectorFunction *local_1e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1e0;
  KnownSystemName local_1d4;
  BVFKind local_1d0;
  undefined1 local_1c9;
  shared_ptr<slang::ast::SystemSubroutine> local_1c8;
  shared_ptr<slang::ast::SystemSubroutine> local_1b8;
  shared_ptr<slang::ast::SystemSubroutine> local_1a8;
  shared_ptr<slang::ast::SystemSubroutine> local_198;
  shared_ptr<slang::ast::SystemSubroutine> local_188;
  shared_ptr<slang::ast::SystemSubroutine> local_178;
  shared_ptr<slang::ast::SystemSubroutine> local_168;
  shared_ptr<slang::ast::SystemSubroutine> local_158;
  shared_ptr<slang::ast::SystemSubroutine> local_148;
  shared_ptr<slang::ast::SystemSubroutine> local_138;
  shared_ptr<slang::ast::SystemSubroutine> local_128;
  shared_ptr<slang::ast::SystemSubroutine> local_118;
  shared_ptr<slang::ast::SystemSubroutine> local_108;
  shared_ptr<slang::ast::SystemSubroutine> local_f8;
  shared_ptr<slang::ast::SystemSubroutine> local_e8;
  shared_ptr<slang::ast::SystemSubroutine> local_d8;
  shared_ptr<slang::ast::SystemSubroutine> local_c8;
  shared_ptr<slang::ast::SystemSubroutine> local_b8;
  shared_ptr<slang::ast::SystemSubroutine> local_a8;
  shared_ptr<slang::ast::SystemSubroutine> local_98;
  shared_ptr<slang::ast::SystemSubroutine> local_88;
  shared_ptr<slang::ast::SystemSubroutine> local_78;
  shared_ptr<slang::ast::SystemSubroutine> local_68;
  shared_ptr<slang::ast::SystemSubroutine> local_58;
  shared_ptr<slang::ast::SystemSubroutine> local_48;
  shared_ptr<slang::ast::SystemSubroutine> local_38;
  shared_ptr<slang::ast::SystemSubroutine> local_28;
  
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::Clog2Function,std::allocator<slang::ast::builtins::Clog2Function>>
            (&_Stack_1e0,(Clog2Function **)&local_1e8,
             (allocator<slang::ast::builtins::Clog2Function> *)&local_1d4);
  local_28.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_SystemSubroutine;
  local_28.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_1e0._M_pi;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_28);
  if (local_28.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::CountBitsFunction,std::allocator<slang::ast::builtins::CountBitsFunction>>
            (&_Stack_1e0,(CountBitsFunction **)&local_1e8,
             (allocator<slang::ast::builtins::CountBitsFunction> *)&local_1d4);
  local_38.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_SystemSubroutine;
  local_38.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_1e0._M_pi;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_38);
  if (local_38.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::CountOnesFunction,std::allocator<slang::ast::builtins::CountOnesFunction>>
            (&_Stack_1e0,(CountOnesFunction **)&local_1e8,
             (allocator<slang::ast::builtins::CountOnesFunction> *)&local_1d4);
  local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_SystemSubroutine;
  local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_1e0._M_pi;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_48);
  if (local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  local_1d4 = OneHot;
  local_1d0 = OneHot;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::BooleanBitVectorFunction,std::allocator<slang::ast::builtins::BooleanBitVectorFunction>,slang::parsing::KnownSystemName,slang::ast::builtins::BooleanBitVectorFunction::BVFKind>
            (&_Stack_1e0,&local_1e8,
             (allocator<slang::ast::builtins::BooleanBitVectorFunction> *)&local_1c9,&local_1d4,
             &local_1d0);
  local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_SystemSubroutine;
  local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_1e0._M_pi;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_58);
  if (local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  local_1d4 = OneHot0;
  local_1d0 = OneHot0;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::BooleanBitVectorFunction,std::allocator<slang::ast::builtins::BooleanBitVectorFunction>,slang::parsing::KnownSystemName,slang::ast::builtins::BooleanBitVectorFunction::BVFKind>
            (&_Stack_1e0,&local_1e8,
             (allocator<slang::ast::builtins::BooleanBitVectorFunction> *)&local_1c9,&local_1d4,
             &local_1d0);
  local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_SystemSubroutine;
  local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_1e0._M_pi;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_68);
  if (local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  local_1d4 = IsUnknown;
  local_1d0 = IsUnknown;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::BooleanBitVectorFunction,std::allocator<slang::ast::builtins::BooleanBitVectorFunction>,slang::parsing::KnownSystemName,slang::ast::builtins::BooleanBitVectorFunction::BVFKind>
            (&_Stack_1e0,&local_1e8,
             (allocator<slang::ast::builtins::BooleanBitVectorFunction> *)&local_1c9,&local_1d4,
             &local_1d0);
  local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_SystemSubroutine;
  local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_1e0._M_pi;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_78);
  if (local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  local_1d4 = Ln;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::RealMath1Function<&log>,std::allocator<slang::ast::builtins::RealMath1Function<&log>>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (&_Stack_1e0,(RealMath1Function<&log> **)&local_1e8,
             (allocator<slang::ast::builtins::RealMath1Function<&log>_> *)&local_1d0,this,&local_1d4
            );
  local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_SystemSubroutine;
  local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_1e0._M_pi;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_88);
  if (local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  local_1d4 = Log10;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::RealMath1Function<&log10>,std::allocator<slang::ast::builtins::RealMath1Function<&log10>>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (&_Stack_1e0,(RealMath1Function<&log10> **)&local_1e8,
             (allocator<slang::ast::builtins::RealMath1Function<&log10>_> *)&local_1d0,this,
             &local_1d4);
  local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_SystemSubroutine;
  local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_1e0._M_pi;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_98);
  if (local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  local_1d4 = Exp;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::RealMath1Function<&exp>,std::allocator<slang::ast::builtins::RealMath1Function<&exp>>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (&_Stack_1e0,(RealMath1Function<&exp> **)&local_1e8,
             (allocator<slang::ast::builtins::RealMath1Function<&exp>_> *)&local_1d0,this,&local_1d4
            );
  local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_SystemSubroutine;
  local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_1e0._M_pi;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_a8);
  if (local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  local_1d4 = Sqrt;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::RealMath1Function<&sqrt>,std::allocator<slang::ast::builtins::RealMath1Function<&sqrt>>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (&_Stack_1e0,(RealMath1Function<&sqrt> **)&local_1e8,
             (allocator<slang::ast::builtins::RealMath1Function<&sqrt>_> *)&local_1d0,this,
             &local_1d4);
  local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_SystemSubroutine;
  local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_1e0._M_pi;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_b8);
  if (local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  local_1d4 = Floor;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::RealMath1Function<&floor>,std::allocator<slang::ast::builtins::RealMath1Function<&floor>>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (&_Stack_1e0,(RealMath1Function<&floor> **)&local_1e8,
             (allocator<slang::ast::builtins::RealMath1Function<&floor>_> *)&local_1d0,this,
             &local_1d4);
  local_c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_SystemSubroutine;
  local_c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_1e0._M_pi;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_c8);
  if (local_c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  local_1d4 = Ceil;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::RealMath1Function<&ceil>,std::allocator<slang::ast::builtins::RealMath1Function<&ceil>>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (&_Stack_1e0,(RealMath1Function<&ceil> **)&local_1e8,
             (allocator<slang::ast::builtins::RealMath1Function<&ceil>_> *)&local_1d0,this,
             &local_1d4);
  local_d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_SystemSubroutine;
  local_d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_1e0._M_pi;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_d8);
  if (local_d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  local_1d4 = Sin;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::RealMath1Function<&sin>,std::allocator<slang::ast::builtins::RealMath1Function<&sin>>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (&_Stack_1e0,(RealMath1Function<&sin> **)&local_1e8,
             (allocator<slang::ast::builtins::RealMath1Function<&sin>_> *)&local_1d0,this,&local_1d4
            );
  local_e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_SystemSubroutine;
  local_e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_1e0._M_pi;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_e8);
  if (local_e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  local_1d4 = Cos;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::RealMath1Function<&cos>,std::allocator<slang::ast::builtins::RealMath1Function<&cos>>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (&_Stack_1e0,(RealMath1Function<&cos> **)&local_1e8,
             (allocator<slang::ast::builtins::RealMath1Function<&cos>_> *)&local_1d0,this,&local_1d4
            );
  local_f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_SystemSubroutine;
  local_f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_1e0._M_pi;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_f8);
  if (local_f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  local_1d4 = Tan;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::RealMath1Function<&tan>,std::allocator<slang::ast::builtins::RealMath1Function<&tan>>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (&_Stack_1e0,(RealMath1Function<&tan> **)&local_1e8,
             (allocator<slang::ast::builtins::RealMath1Function<&tan>_> *)&local_1d0,this,&local_1d4
            );
  local_108.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_SystemSubroutine;
  local_108.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Stack_1e0._M_pi;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_108);
  if (local_108.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  local_1d4 = Asin;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::RealMath1Function<&asin>,std::allocator<slang::ast::builtins::RealMath1Function<&asin>>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (&_Stack_1e0,(RealMath1Function<&asin> **)&local_1e8,
             (allocator<slang::ast::builtins::RealMath1Function<&asin>_> *)&local_1d0,this,
             &local_1d4);
  local_118.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_SystemSubroutine;
  local_118.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Stack_1e0._M_pi;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_118);
  if (local_118.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  local_1d4 = Acos;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::RealMath1Function<&acos>,std::allocator<slang::ast::builtins::RealMath1Function<&acos>>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (&_Stack_1e0,(RealMath1Function<&acos> **)&local_1e8,
             (allocator<slang::ast::builtins::RealMath1Function<&acos>_> *)&local_1d0,this,
             &local_1d4);
  local_128.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_SystemSubroutine;
  local_128.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Stack_1e0._M_pi;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_128);
  if (local_128.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  local_1d4 = Atan;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::RealMath1Function<&atan>,std::allocator<slang::ast::builtins::RealMath1Function<&atan>>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (&_Stack_1e0,(RealMath1Function<&atan> **)&local_1e8,
             (allocator<slang::ast::builtins::RealMath1Function<&atan>_> *)&local_1d0,this,
             &local_1d4);
  local_138.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_SystemSubroutine;
  local_138.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Stack_1e0._M_pi;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_138);
  if (local_138.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  local_1d4 = Sinh;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::RealMath1Function<&sinh>,std::allocator<slang::ast::builtins::RealMath1Function<&sinh>>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (&_Stack_1e0,(RealMath1Function<&sinh> **)&local_1e8,
             (allocator<slang::ast::builtins::RealMath1Function<&sinh>_> *)&local_1d0,this,
             &local_1d4);
  local_148.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_SystemSubroutine;
  local_148.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Stack_1e0._M_pi;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_148);
  if (local_148.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  local_1d4 = Cosh;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::RealMath1Function<&cosh>,std::allocator<slang::ast::builtins::RealMath1Function<&cosh>>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (&_Stack_1e0,(RealMath1Function<&cosh> **)&local_1e8,
             (allocator<slang::ast::builtins::RealMath1Function<&cosh>_> *)&local_1d0,this,
             &local_1d4);
  local_158.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_SystemSubroutine;
  local_158.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Stack_1e0._M_pi;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_158);
  if (local_158.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  local_1d4 = Tanh;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::RealMath1Function<&tanh>,std::allocator<slang::ast::builtins::RealMath1Function<&tanh>>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (&_Stack_1e0,(RealMath1Function<&tanh> **)&local_1e8,
             (allocator<slang::ast::builtins::RealMath1Function<&tanh>_> *)&local_1d0,this,
             &local_1d4);
  local_168.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_SystemSubroutine;
  local_168.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Stack_1e0._M_pi;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_168);
  if (local_168.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  local_1d4 = Asinh;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::RealMath1Function<&asinh>,std::allocator<slang::ast::builtins::RealMath1Function<&asinh>>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (&_Stack_1e0,(RealMath1Function<&asinh> **)&local_1e8,
             (allocator<slang::ast::builtins::RealMath1Function<&asinh>_> *)&local_1d0,this,
             &local_1d4);
  local_178.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_SystemSubroutine;
  local_178.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Stack_1e0._M_pi;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_178);
  if (local_178.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_178.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  local_1d4 = Acosh;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::RealMath1Function<&acosh>,std::allocator<slang::ast::builtins::RealMath1Function<&acosh>>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (&_Stack_1e0,(RealMath1Function<&acosh> **)&local_1e8,
             (allocator<slang::ast::builtins::RealMath1Function<&acosh>_> *)&local_1d0,this,
             &local_1d4);
  local_188.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_SystemSubroutine;
  local_188.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Stack_1e0._M_pi;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_188);
  if (local_188.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  local_1d4 = Atanh;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::RealMath1Function<&atanh>,std::allocator<slang::ast::builtins::RealMath1Function<&atanh>>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (&_Stack_1e0,(RealMath1Function<&atanh> **)&local_1e8,
             (allocator<slang::ast::builtins::RealMath1Function<&atanh>_> *)&local_1d0,this,
             &local_1d4);
  local_198.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_SystemSubroutine;
  local_198.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Stack_1e0._M_pi;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_198);
  if (local_198.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_198.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  local_1d4 = Pow;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::RealMath2Function<&pow>,std::allocator<slang::ast::builtins::RealMath2Function<&pow>>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (&_Stack_1e0,(RealMath2Function<&pow> **)&local_1e8,
             (allocator<slang::ast::builtins::RealMath2Function<&pow>_> *)&local_1d0,this,&local_1d4
            );
  local_1a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_SystemSubroutine;
  local_1a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Stack_1e0._M_pi;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_1a8);
  if (local_1a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  local_1d4 = Atan2;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::RealMath2Function<&atan2>,std::allocator<slang::ast::builtins::RealMath2Function<&atan2>>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (&_Stack_1e0,(RealMath2Function<&atan2> **)&local_1e8,
             (allocator<slang::ast::builtins::RealMath2Function<&atan2>_> *)&local_1d0,this,
             &local_1d4);
  local_1b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_SystemSubroutine;
  local_1b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Stack_1e0._M_pi;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_1b8);
  if (local_1b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  local_1d4 = Hypot;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::RealMath2Function<&hypot>,std::allocator<slang::ast::builtins::RealMath2Function<&hypot>>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (&_Stack_1e0,(RealMath2Function<&hypot> **)&local_1e8,
             (allocator<slang::ast::builtins::RealMath2Function<&hypot>_> *)&local_1d0,this,
             &local_1d4);
  local_1c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_SystemSubroutine;
  local_1c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Stack_1e0._M_pi;
  local_1e8 = (BooleanBitVectorFunction *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_1c8);
  if (local_1c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c8.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  return;
}

Assistant:

void Builtins::registerMathFuncs() {
    using parsing::KnownSystemName;

    addSystemSubroutine(std::make_shared<Clog2Function>());
    addSystemSubroutine(std::make_shared<CountBitsFunction>());
    addSystemSubroutine(std::make_shared<CountOnesFunction>());

#define REGISTER(name, kind) \
    addSystemSubroutine(     \
        std::make_shared<BooleanBitVectorFunction>(name, BooleanBitVectorFunction::kind))

    REGISTER(KnownSystemName::OneHot, OneHot);
    REGISTER(KnownSystemName::OneHot0, OneHot0);
    REGISTER(KnownSystemName::IsUnknown, IsUnknown);

#undef REGISTER
#define REGISTER(name, func) \
    addSystemSubroutine(std::make_shared<RealMath1Function<(func)>>(*this, name))

    REGISTER(KnownSystemName::Ln, std::log);
    REGISTER(KnownSystemName::Log10, std::log10);
    REGISTER(KnownSystemName::Exp, std::exp);
    REGISTER(KnownSystemName::Sqrt, std::sqrt);
    REGISTER(KnownSystemName::Floor, std::floor);
    REGISTER(KnownSystemName::Ceil, std::ceil);
    REGISTER(KnownSystemName::Sin, std::sin);
    REGISTER(KnownSystemName::Cos, std::cos);
    REGISTER(KnownSystemName::Tan, std::tan);
    REGISTER(KnownSystemName::Asin, std::asin);
    REGISTER(KnownSystemName::Acos, std::acos);
    REGISTER(KnownSystemName::Atan, std::atan);
    REGISTER(KnownSystemName::Sinh, std::sinh);
    REGISTER(KnownSystemName::Cosh, std::cosh);
    REGISTER(KnownSystemName::Tanh, std::tanh);
    REGISTER(KnownSystemName::Asinh, std::asinh);
    REGISTER(KnownSystemName::Acosh, std::acosh);
    REGISTER(KnownSystemName::Atanh, std::atanh);

#undef REGISTER
#define REGISTER(name, func) \
    addSystemSubroutine(std::make_shared<RealMath2Function<(func)>>(*this, name))

    REGISTER(KnownSystemName::Pow, std::pow);
    REGISTER(KnownSystemName::Atan2, std::atan2);
    REGISTER(KnownSystemName::Hypot, std::hypot);

#undef REGISTER
}